

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.h
# Opt level: O2

void __thiscall
capnp::compiler::BrandScope::BrandScope
          (BrandScope *this,BrandScope *base,Array<capnp::compiler::BrandedDecl> *params)

{
  uint *puVar1;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> local_38;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> local_28;
  
  (this->super_Refcounted).refcount = 0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00275250;
  this->errorReporter = base->errorReporter;
  (this->parent).ptr.disposer = (Disposer *)0x0;
  (this->parent).ptr.ptr = (BrandScope *)0x0;
  this->leafId = base->leafId;
  this->leafParamCount = base->leafParamCount;
  this->inherited = false;
  (this->params).ptr = params->ptr;
  (this->params).size_ = params->size_;
  (this->params).disposer = params->disposer;
  params->ptr = (BrandedDecl *)0x0;
  params->size_ = 0;
  local_38.disposer = (Disposer *)(base->parent).ptr.ptr;
  if ((BrandScope *)local_38.disposer != (BrandScope *)0x0) {
    puVar1 = &(((BrandScope *)local_38.disposer)->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_38.ptr = (BrandScope *)0x0;
    local_28.disposer = local_38.disposer;
    local_28.ptr = (BrandScope *)local_38.disposer;
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator=(&(this->parent).ptr,&local_28);
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose(&local_28);
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose(&local_38);
  }
  return;
}

Assistant:

inline BrandedDecl(Resolver::ResolvedDecl decl,
                     kj::Own<BrandScope>&& brand,
                     Expression::Reader source)
      : brand(kj::mv(brand)), source(source) {
    // `source`, is the expression which specified this branded decl. It is provided so that errors
    // can be reported against it. It is acceptable to pass a default-initialized reader if there's
    // no source expression; errors will then be reported at 0, 0.

    body.init<Resolver::ResolvedDecl>(kj::mv(decl));
  }